

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amount_tests.cpp
# Opt level: O2

void __thiscall amount_tests::BinaryOperatorTest::test_method(BinaryOperatorTest *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  check_type cVar3;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  assertion_result local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x79;
  file.m_begin = (iterator)&local_48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "a < b";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_a8 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar3,(size_t)&local_b0,0x79);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  file_00.m_end = (iterator)0x7a;
  file_00.m_begin = (iterator)&local_c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,msg_00
            );
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "b > a";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_d8 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar3,(size_t)&local_e0,0x7a);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  file_01.m_end = (iterator)0x7b;
  file_01.m_begin = (iterator)&local_f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_100,
             msg_01);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "a == a";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_108 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar3,(size_t)&local_110,0x7b);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  file_02.m_end = (iterator)0x7c;
  file_02.m_begin = (iterator)&local_120;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_130,
             msg_02);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "a <= b";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_138 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar3,(size_t)&local_140,0x7c);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  file_03.m_end = (iterator)0x7d;
  file_03.m_begin = (iterator)&local_150;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_160,
             msg_03);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "a <= a";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_168 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar3,(size_t)&local_170,0x7d);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  file_04.m_end = (iterator)0x7e;
  file_04.m_begin = (iterator)&local_180;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_190,
             msg_04);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "b >= a";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_198 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar3,(size_t)&local_1a0,0x7e);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar2;
  msg_05.m_begin = pvVar1;
  file_05.m_end = (iterator)0x7f;
  file_05.m_begin = (iterator)&local_1b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1c0,
             msg_05);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "b >= b";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_1c8 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar3,(size_t)&local_1d0,0x7f);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar2;
  msg_06.m_begin = pvVar1;
  file_06.m_end = (iterator)0x82;
  file_06.m_begin = (iterator)&local_1e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1f0,
             msg_06);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "a == b";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,0xb51afa,(size_t)&stack0xfffffffffffffe00,0x82);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(BinaryOperatorTest)
{
    CFeeRate a, b;
    a = CFeeRate(1);
    b = CFeeRate(2);
    BOOST_CHECK(a < b);
    BOOST_CHECK(b > a);
    BOOST_CHECK(a == a);
    BOOST_CHECK(a <= b);
    BOOST_CHECK(a <= a);
    BOOST_CHECK(b >= a);
    BOOST_CHECK(b >= b);
    // a should be 0.00000002 BTC/kvB now
    a += a;
    BOOST_CHECK(a == b);
}